

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall XipFile::TocEntry::recordmemusage(TocEntry *this,XipFile *xip,allocmap *m)

{
  uint32_t ofs;
  uint *puVar1;
  uint uVar2;
  element_type *peVar3;
  long lVar4;
  ulong uVar5;
  string local_50;
  
  buildexe(this,xip);
  ofs = (this->super_XipEntry)._rvaname;
  XipEntry::name_abi_cxx11_(&local_50,&this->super_XipEntry,xip);
  allocmap::markused(m,ofs,((uint)local_50._M_string_length | 3) + 1,"modname");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  allocmap::markused(m,this->_rvae32,(exe_reconstructor::e32rom::g_wm2003 ^ 1) * 4 + 0x6c,"e32hdr");
  allocmap::markused(m,this->_rvao32,
                     (uint)((((this->_exe).
                              super___shared_ptr<exe_reconstructor,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->_e32rom).
                            super___shared_ptr<exe_reconstructor::e32rom,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->objcnt * 0x18,"o32hdr");
  peVar3 = (this->_exe).super___shared_ptr<exe_reconstructor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (((peVar3->_e32rom).super___shared_ptr<exe_reconstructor::e32rom,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->objcnt != 0) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      puVar1 = *(uint **)((long)&((peVar3->_o32rom).
                                  super__Vector_base<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                 super___shared_ptr<exe_reconstructor::o32rom,_(__gnu_cxx::_Lock_policy)2>
                         + lVar4);
      uVar2 = *puVar1;
      if (puVar1[2] < *puVar1) {
        uVar2 = puVar1[2];
      }
      allocmap::markused(m,puVar1[3],(uVar2 - 1 | 3) + 1,"objdata");
      uVar5 = uVar5 + 1;
      peVar3 = (this->_exe).super___shared_ptr<exe_reconstructor,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < ((peVar3->_e32rom).
                      super___shared_ptr<exe_reconstructor::e32rom,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->objcnt);
  }
  return;
}

Assistant:

virtual void recordmemusage(XipFile& xip, allocmap& m)
        {
            buildexe(xip);

            m.markused(_rvaname, roundsize(name(xip).size()+1, 4), "modname");

            size_t e32size= exe_reconstructor::e32rom::size();
            size_t o32size= exe_reconstructor::o32rom::size();

            m.markused(_rvae32, e32size, "e32hdr");
            m.markused(_rvao32, o32size*_exe->nr_o32_sections(), "o32hdr");
            for (int i=0 ; i<_exe->nr_o32_sections() ; i++) {
                m.markused(_exe->o32datarva(i), roundsize(_exe->o32datasize(i), 4), "objdata");
            }
        }